

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

ssize_t __thiscall
jaegertracing::agent::thrift::Agent_emitBatch_args::read
          (Agent_emitBatch_args *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  bool bVar6;
  short *psVar7;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  short local_66;
  int local_64;
  Agent_emitBatch_args *local_60;
  Batch *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->batch;
  local_60 = this;
  while( true ) {
    psVar7 = &local_66;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_64,&local_66);
    if (local_64 == 0) break;
    bVar6 = local_64 != 0xc || local_66 != 1;
    if (bVar6) {
      iVar3 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
    }
    else {
      sVar5 = jaegertracing::thrift::Batch::read
                        (local_58,__fd,__buf_00,CONCAT71((int7)((ulong)psVar7 >> 8),bVar6));
      iVar3 = (int)sVar5;
      local_60->__isset = (_Agent_emitBatch_args__isset)((byte)local_60->__isset | 1);
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  }
  iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar1);
}

Assistant:

uint32_t Agent_emitBatch_args::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->batch.read(iprot);
          this->__isset.batch = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}